

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.h
# Opt level: O1

void __thiscall
hedg::Stream_Client::
send<boost::asio::basic_streambuf<std::allocator<char>>&,hedg::params::stream_authenticate>
          (Stream_Client *this,
          _func_void_basic_streambuf<std::allocator<char>_>_ptr_stream_authenticate *f,
          stream_authenticate *p)

{
  streambuf *psVar1;
  pointer pcVar2;
  stream_authenticate sVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  undefined8 in_stack_ffffffffffffff50;
  long in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  basic_streambuf<std::allocator<char>_> *local_80;
  int local_78;
  uint uStack_74;
  error_category *peStack_70;
  undefined **local_68 [2];
  error_code local_58;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  psVar1 = &(this->super_Client<hedg::Stream_Client>).inp_buff_;
  pcVar2 = (p->session_id)._M_dataplus._M_p;
  puVar5 = &stack0xffffffffffffff58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff48,pcVar2,pcVar2 + (p->session_id)._M_string_length);
  sVar3.session_id._M_string_length = in_stack_ffffffffffffff50;
  sVar3.session_id._M_dataplus._M_p = puVar5;
  sVar3.session_id.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
  sVar3.session_id.field_2._8_8_ = in_stack_ffffffffffffff60;
  (*f)(psVar1,sVar3);
  if (puVar5 != &stack0xffffffffffffff58) {
    operator_delete(puVar5,in_stack_ffffffffffffff58 + 1);
  }
  local_78 = 0;
  uStack_74 = uStack_74 & 0xffffff00;
  peStack_70 = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  local_80 = psVar1;
  boost::asio::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_all_t>
            (&(this->super_Client<hedg::Stream_Client>).sock_,&local_80,&local_78,0);
  local_58.cat_ = peStack_70;
  if ((char)uStack_74 != '\x01') {
    return;
  }
  uVar4._4_4_ = uStack_74;
  uVar4._0_4_ = local_78;
  std::runtime_error::runtime_error((runtime_error *)local_68,"write");
  local_68[0] = &PTR__system_error_001ed158;
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_58._0_8_ = uVar4;
  boost::throw_exception<boost::system::system_error>((system_error *)local_68);
}

Assistant:

void send(void(*f)(Buff, T), T p) {
		f(inp_buff_, p);
		boost::asio::write(sock_, inp_buff_);
	}